

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O1

FILE * __thiscall FlatFileSeq::Open(FlatFileSeq *this,FlatFilePos *pos,bool read_only)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string_view source_file;
  string_view source_file_00;
  char cVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  Logger *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char *__modes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  string log_msg;
  path path;
  long *local_128 [2];
  long local_118 [2];
  path local_108;
  path local_e0 [3];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos->nFile == -1) {
    __stream = (FILE *)0x0;
    goto LAB_0046eb93;
  }
  FileName((path *)local_e0,this,pos);
  std::filesystem::__cxx11::path::parent_path();
  cVar2 = std::filesystem::symlink_status(&local_108);
  if (cVar2 == '\x03') {
    cVar2 = std::filesystem::status(&local_108);
    if (cVar2 != '\x02') goto LAB_0046ea66;
  }
  else {
LAB_0046ea66:
    std::filesystem::create_directories(&local_108);
  }
  std::filesystem::__cxx11::path::~path(&local_108);
  __modes = "rb+";
  if (read_only) {
    __modes = "rb";
  }
  __stream = fsbridge::fopen((char *)local_e0,__modes);
  if (__stream == (FILE *)0x0 && !read_only) {
    __stream = fsbridge::fopen((char *)local_e0,"wb+");
  }
  if (__stream == (FILE *)0x0) {
    local_128[0] = local_118;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_128,local_e0[0]._M_pathname._M_dataplus._M_p,
               local_e0[0]._M_pathname._M_dataplus._M_p + local_e0[0]._M_pathname._M_string_length);
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar5);
    if (bVar3) {
      paVar1 = &local_108._M_pathname.field_2;
      local_108._M_pathname._M_string_length = 0;
      local_108._M_pathname.field_2._M_local_buf[0] = '\0';
      local_108._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      tinyformat::format<std::__cxx11::string>
                (&local_58,(tinyformat *)"Unable to open file %s\n",(char *)local_128,in_RCX);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_108._M_pathname,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pLVar5 = LogInstance();
      local_58._M_dataplus._M_p = (pointer)0x55;
      local_58._M_string_length = 0x853e92;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/flatfile.cpp";
      source_file._M_len = 0x55;
      str._M_str = local_108._M_pathname._M_dataplus._M_p;
      str._M_len = local_108._M_pathname._M_string_length;
      logging_function._M_str = "Open";
      logging_function._M_len = 4;
      BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x2c,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_108._M_pathname._M_dataplus._M_p,
                        CONCAT71(local_108._M_pathname.field_2._M_allocated_capacity._1_7_,
                                 local_108._M_pathname.field_2._M_local_buf[0]) + 1);
      }
    }
    if (local_128[0] != local_118) {
      operator_delete(local_128[0],local_118[0] + 1);
    }
LAB_0046eb87:
    __stream = (FILE *)0x0;
  }
  else if ((ulong)pos->nPos != 0) {
    iVar4 = fseek(__stream,(ulong)pos->nPos,0);
    if (iVar4 != 0) {
      local_128[0] = local_118;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,local_e0[0]._M_pathname._M_dataplus._M_p,
                 local_e0[0]._M_pathname._M_dataplus._M_p + local_e0[0]._M_pathname._M_string_length
                );
      pLVar5 = LogInstance();
      bVar3 = BCLog::Logger::Enabled(pLVar5);
      if (bVar3) {
        paVar1 = &local_108._M_pathname.field_2;
        local_108._M_pathname._M_string_length = 0;
        local_108._M_pathname.field_2._M_local_buf[0] = '\0';
        local_108._M_pathname._M_dataplus._M_p = (pointer)paVar1;
        tinyformat::format<unsigned_int,std::__cxx11::string>
                  (&local_58,(tinyformat *)"Unable to seek to position %u of %s\n",
                   (char *)&pos->nPos,(uint *)local_128,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_108._M_pathname,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        pLVar5 = LogInstance();
        local_58._M_dataplus._M_p = (pointer)0x55;
        local_58._M_string_length = 0x853e92;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/flatfile.cpp"
        ;
        source_file_00._M_len = 0x55;
        str_00._M_str = local_108._M_pathname._M_dataplus._M_p;
        str_00._M_len = local_108._M_pathname._M_string_length;
        logging_function_00._M_str = "Open";
        logging_function_00._M_len = 4;
        BCLog::Logger::LogPrintStr(pLVar5,str_00,logging_function_00,source_file_00,0x30,ALL,Info);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._M_pathname._M_dataplus._M_p,
                          CONCAT71(local_108._M_pathname.field_2._M_allocated_capacity._1_7_,
                                   local_108._M_pathname.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_128[0] != local_118) {
        operator_delete(local_128[0],local_118[0] + 1);
      }
      fclose(__stream);
      goto LAB_0046eb87;
    }
  }
  std::filesystem::__cxx11::path::~path(local_e0);
LAB_0046eb93:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (FILE *)__stream;
  }
  __stack_chk_fail();
}

Assistant:

FILE* FlatFileSeq::Open(const FlatFilePos& pos, bool read_only) const
{
    if (pos.IsNull()) {
        return nullptr;
    }
    fs::path path = FileName(pos);
    fs::create_directories(path.parent_path());
    FILE* file = fsbridge::fopen(path, read_only ? "rb": "rb+");
    if (!file && !read_only)
        file = fsbridge::fopen(path, "wb+");
    if (!file) {
        LogPrintf("Unable to open file %s\n", fs::PathToString(path));
        return nullptr;
    }
    if (pos.nPos && fseek(file, pos.nPos, SEEK_SET)) {
        LogPrintf("Unable to seek to position %u of %s\n", pos.nPos, fs::PathToString(path));
        fclose(file);
        return nullptr;
    }
    return file;
}